

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O0

void testMinMaxEigenValue<Imath_2_5::Matrix33<float>>(Matrix33<float> *A)

{
  uint uVar1;
  Matrix33<float> *pMVar2;
  float fVar3;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  int i;
  int dim;
  Matrix33<float> A3;
  Matrix33<float> A2;
  Matrix33<float> A1;
  T threshold;
  Matrix33<float> V;
  Matrix33<float> U;
  TV S;
  TV maxV;
  TV minV;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int i_00;
  Matrix33 local_e4 [20];
  Matrix33<float> *in_stack_ffffffffffffff30;
  Matrix33 local_c0 [36];
  Matrix33 local_9c [36];
  BaseType_conflict1 local_78;
  Matrix33<float> local_74;
  Matrix33 local_50 [36];
  Vec3<float> local_2c;
  Vec3<float> local_20;
  Vec3<float> local_14;
  
  Imath_2_5::Vec3<float>::Vec3(&local_14);
  Imath_2_5::Vec3<float>::Vec3(&local_20);
  Imath_2_5::Vec3<float>::Vec3(&local_2c);
  Imath_2_5::Matrix33<float>::Matrix33
            ((Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  Imath_2_5::Matrix33<float>::Matrix33
            ((Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  local_78 = computeThreshold<Imath_2_5::Matrix33<float>>(in_stack_ffffffffffffff30);
  Imath_2_5::Matrix33<float>::Matrix33
            ((Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             (Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  Imath_2_5::minEigenVector<Imath_2_5::Matrix33<float>,Imath_2_5::Vec3<float>>
            (local_9c,(Vec3 *)&local_14);
  Imath_2_5::Matrix33<float>::Matrix33
            ((Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             (Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  Imath_2_5::maxEigenVector<Imath_2_5::Matrix33<float>,Imath_2_5::Vec3<float>>
            (local_c0,(Vec3 *)&local_20);
  Imath_2_5::Matrix33<float>::Matrix33
            ((Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             (Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  fVar3 = Imath_2_5::limits<float>::epsilon();
  Imath_2_5::jacobiSVD<float>(local_e4,local_50,(Vec3 *)&local_2c,(Matrix33 *)&local_74,fVar3,false)
  ;
  uVar1 = Imath_2_5::Matrix33<float>::dimensions();
  i_00 = 0;
  while( true ) {
    if ((int)uVar1 <= i_00) {
      return;
    }
    Imath_2_5::Vec3<float>::operator[](&local_14,i_00);
    pMVar2 = &local_74;
    Imath_2_5::Matrix33<float>::operator[](pMVar2,i_00);
    std::abs((int)pMVar2);
    if (local_78 <= extraout_XMM0_Da) break;
    Imath_2_5::Vec3<float>::operator[](&local_20,i_00);
    pMVar2 = &local_74;
    Imath_2_5::Matrix33<float>::operator[](pMVar2,i_00);
    std::abs((int)pMVar2);
    if (local_78 <= extraout_XMM0_Da_00) {
      __assert_fail("abs(maxV[i]-V[i][0]) < threshold",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                    ,0xbb,"void testMinMaxEigenValue(const TM &) [TM = Imath_2_5::Matrix33<float>]")
      ;
    }
    i_00 = i_00 + 1;
  }
  __assert_fail("abs(minV[i]-V[i][dim - 1]) < threshold",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                ,0xba,"void testMinMaxEigenValue(const TM &) [TM = Imath_2_5::Matrix33<float>]");
}

Assistant:

void
testMinMaxEigenValue(const TM& A)
{
  typedef typename TM::BaseVecType TV;
  typedef typename TM::BaseType T;

  TV minV, maxV, S;
  TM U, V;
  
  const T threshold = computeThreshold(A);

  {
      TM A1(A);
      minEigenVector(A1, minV);
      TM A2(A);
      maxEigenVector(A2, maxV);
  }
  {
      TM A3(A);
      jacobiSVD(A3, U, S, V);
  }

  const int dim = TM::dimensions();

  for(int i = 0; i < dim; ++i) {
      assert(abs(minV[i]-V[i][dim - 1]) < threshold);
      assert(abs(maxV[i]-V[i][0]) < threshold);
  }
}